

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fse_decompress.c
# Opt level: O0

size_t FSE_decompress_wksp_body_default
                 (void *dst,size_t dstCapacity,void *cSrc,size_t cSrcSize,uint maxLog,
                 void *workSpace,size_t wkspSize)

{
  int iVar1;
  BYTE *pBVar2;
  uchar uVar3;
  uint uVar4;
  size_t sVar5;
  size_t code;
  BYTE *pBVar6;
  byte bVar7;
  uchar *puVar8;
  BYTE *pBVar9;
  bool bVar10;
  void *workSpace_local;
  uint maxLog_local;
  size_t cSrcSize_local;
  void *cSrc_local;
  size_t dstCapacity_local;
  void *dst_local;
  U32 fastMode;
  FSE_DTableHeader *DTableH;
  void *ptr;
  size_t _var_err__;
  size_t NCountLength;
  FSE_DecompressWksp *wksp;
  uint maxSymbolValue;
  uint tableLog;
  BYTE *ip;
  BYTE *istart;
  size_t local_228;
  void *local_220;
  uint local_214;
  size_t local_210;
  void *local_208;
  size_t local_200;
  BYTE *local_1f8;
  size_t local_1f0;
  size_t local_1e8;
  size_t _var_err___1;
  FSE_DState_t state2;
  FSE_DState_t state1;
  BIT_DStream_t bitD;
  BYTE *olimit;
  BYTE *omax;
  BYTE *op;
  BYTE *ostart;
  size_t local_148;
  size_t _var_err___2;
  FSE_DState_t state2_1;
  FSE_DState_t state1_1;
  BIT_DStream_t bitD_1;
  BYTE *olimit_1;
  BYTE *omax_1;
  BYTE *op_1;
  BYTE *ostart_1;
  size_t local_a0;
  BIT_DStream_status local_98;
  uint local_94;
  BIT_DStream_status result_5;
  U32 nbBytes_5;
  BIT_DStream_status local_84;
  BIT_DStream_status local_80;
  uint local_7c;
  BIT_DStream_status result_4;
  U32 nbBytes_4;
  BIT_DStream_status local_6c;
  BIT_DStream_status local_68;
  uint local_64;
  BIT_DStream_status result_3;
  U32 nbBytes_3;
  BIT_DStream_status local_54;
  BIT_DStream_status local_50;
  uint local_4c;
  BIT_DStream_status result_2;
  U32 nbBytes_2;
  BIT_DStream_status local_3c;
  BIT_DStream_status local_38;
  uint local_34;
  BIT_DStream_status result_1;
  U32 nbBytes_1;
  BIT_DStream_status local_24;
  BIT_DStream_status local_20;
  uint local_1c;
  BIT_DStream_status result;
  U32 nbBytes;
  BIT_DStream_status local_c;
  
  local_228 = wkspSize;
  istart._4_4_ = 0;
  wksp._0_4_ = 0xff;
  if (wkspSize < 0x204) {
    local_1f0 = 0xffffffffffffffff;
  }
  else {
    _maxSymbolValue = cSrc;
    ip = (BYTE *)cSrc;
    local_220 = workSpace;
    local_214 = maxLog;
    local_210 = cSrcSize;
    local_208 = cSrc;
    local_200 = dstCapacity;
    local_1f8 = (BYTE *)dst;
    sVar5 = FSE_readNCount_bmi2((short *)workSpace,(uint *)&wksp,(uint *)((long)&wksp + 4),cSrc,
                                cSrcSize,0);
    uVar4 = ERR_isError(sVar5);
    local_1f0 = sVar5;
    if (uVar4 == 0) {
      if (local_214 < wksp._4_4_) {
        local_1f0 = 0xffffffffffffffd4;
      }
      else {
        if (local_210 < sVar5) {
          __assert_fail("NCountLength <= cSrcSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/common/fse_decompress.c"
                        ,0x108,
                        "size_t FSE_decompress_wksp_body(void *, size_t, const void *, size_t, unsigned int, void *, size_t, int)"
                       );
        }
        _maxSymbolValue = (void *)(sVar5 + (long)_maxSymbolValue);
        local_210 = local_210 - sVar5;
        bVar7 = (byte)wksp._4_4_;
        if (local_228 <
            ((long)((1 << (bVar7 & 0x1f)) + 2) +
             ((ulong)((uint)wksp + 1) * 2 + (1L << (bVar7 & 0x3f)) + 0xb >> 2) + 0x81) * 4) {
          local_1f0 = 0xffffffffffffffd4;
        }
        else {
          if (local_228 < (long)((1 << (bVar7 & 0x1f)) + 1) * 4 + 0x204U) {
            __assert_fail("sizeof(*wksp) + FSE_DTABLE_SIZE(tableLog) <= wkspSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/common/fse_decompress.c"
                          ,0x10e,
                          "size_t FSE_decompress_wksp_body(void *, size_t, const void *, size_t, unsigned int, void *, size_t, int)"
                         );
          }
          local_220 = (void *)((long)local_220 + (long)((1 << (bVar7 & 0x1f)) + 1) * 4 + 0x204);
          local_228 = local_228 - ((long)((1 << (bVar7 & 0x1f)) + 1) * 4 + 0x204);
          code = FSE_buildDTable_internal
                           ((FSE_DTable *)((long)workSpace + 0x200),(short *)workSpace,(uint)wksp,
                            wksp._4_4_,local_220,local_228);
          uVar4 = ERR_isError(code);
          pBVar2 = local_1f8;
          sVar5 = local_200;
          local_1f0 = code;
          if (uVar4 == 0) {
            if (*(short *)((long)workSpace + 0x202) == 0) {
              omax_1 = local_1f8;
              pBVar6 = local_1f8 + (local_200 - 3);
              local_a0 = BIT_initDStream((BIT_DStream_t *)&state1_1.table,_maxSymbolValue,local_210)
              ;
              uVar4 = ERR_isError(local_a0);
              if (uVar4 == 0) {
                FSE_initDState((FSE_DState_t *)&state2_1.table,(BIT_DStream_t *)&state1_1.table,
                               (FSE_DTable *)((long)workSpace + 0x200));
                FSE_initDState((FSE_DState_t *)&_var_err___2,(BIT_DStream_t *)&state1_1.table,
                               (FSE_DTable *)((long)workSpace + 0x200));
                while( true ) {
                  iVar1 = (int)bitD_1.ptr;
                  if ((uint)bitD_1.bitContainer < 0x41) {
                    if ((ulong)bitD_1._8_8_ < bitD_1.start) {
                      if ((char *)bitD_1._8_8_ == bitD_1.ptr) {
                        if ((uint)bitD_1.bitContainer < 0x40) {
                          local_54 = BIT_DStream_endOfBuffer;
                        }
                        else {
                          local_54 = BIT_DStream_completed;
                        }
                      }
                      else {
                        local_64 = (uint)bitD_1.bitContainer >> 3;
                        bVar10 = (char *)(bitD_1._8_8_ - (ulong)local_64) < bitD_1.ptr;
                        if (bVar10) {
                          local_64 = bitD_1.bitsConsumed - iVar1;
                        }
                        local_68 = (BIT_DStream_status)bVar10;
                        bitD_1._8_8_ = bitD_1._8_8_ - (ulong)local_64;
                        bitD_1.bitContainer._0_4_ = (uint)bitD_1.bitContainer + local_64 * -8;
                        state1_1.table = (void *)MEM_readLEST((void *)bitD_1._8_8_);
                        local_54 = local_68;
                      }
                    }
                    else {
                      local_54 = BIT_reloadDStreamFast((BIT_DStream_t *)&state1_1.table);
                    }
                  }
                  else {
                    local_54 = BIT_DStream_overflow;
                  }
                  pBVar9 = omax_1;
                  if (local_54 != BIT_DStream_unfinished || pBVar6 <= omax_1) break;
                  uVar3 = FSE_decodeSymbol((FSE_DState_t *)&state2_1.table,
                                           (BIT_DStream_t *)&state1_1.table);
                  *omax_1 = uVar3;
                  uVar3 = FSE_decodeSymbol((FSE_DState_t *)&_var_err___2,
                                           (BIT_DStream_t *)&state1_1.table);
                  omax_1[1] = uVar3;
                  uVar3 = FSE_decodeSymbol((FSE_DState_t *)&state2_1.table,
                                           (BIT_DStream_t *)&state1_1.table);
                  omax_1[2] = uVar3;
                  uVar3 = FSE_decodeSymbol((FSE_DState_t *)&_var_err___2,
                                           (BIT_DStream_t *)&state1_1.table);
                  omax_1[3] = uVar3;
                  omax_1 = omax_1 + 4;
                }
                do {
                  omax_1 = pBVar9;
                  if (pBVar2 + (sVar5 - 2) < omax_1) {
                    local_a0 = 0xffffffffffffffba;
                    goto LAB_00f17a21;
                  }
                  uVar3 = FSE_decodeSymbol((FSE_DState_t *)&state2_1.table,
                                           (BIT_DStream_t *)&state1_1.table);
                  puVar8 = omax_1 + 1;
                  *omax_1 = uVar3;
                  if ((uint)bitD_1.bitContainer < 0x41) {
                    if ((ulong)bitD_1._8_8_ < bitD_1.start) {
                      if ((char *)bitD_1._8_8_ == bitD_1.ptr) {
                        if ((uint)bitD_1.bitContainer < 0x40) {
                          local_6c = BIT_DStream_endOfBuffer;
                        }
                        else {
                          local_6c = BIT_DStream_completed;
                        }
                      }
                      else {
                        local_7c = (uint)bitD_1.bitContainer >> 3;
                        bVar10 = (char *)(bitD_1._8_8_ - (ulong)local_7c) < bitD_1.ptr;
                        if (bVar10) {
                          local_7c = bitD_1.bitsConsumed - iVar1;
                        }
                        local_80 = (BIT_DStream_status)bVar10;
                        bitD_1._8_8_ = bitD_1._8_8_ - (ulong)local_7c;
                        bitD_1.bitContainer._0_4_ = (uint)bitD_1.bitContainer + local_7c * -8;
                        state1_1.table = (void *)MEM_readLEST((void *)bitD_1._8_8_);
                        local_6c = local_80;
                      }
                    }
                    else {
                      local_6c = BIT_reloadDStreamFast((BIT_DStream_t *)&state1_1.table);
                    }
                  }
                  else {
                    local_6c = BIT_DStream_overflow;
                  }
                  if (local_6c == BIT_DStream_overflow) {
                    uVar3 = FSE_decodeSymbol((FSE_DState_t *)&_var_err___2,
                                             (BIT_DStream_t *)&state1_1.table);
                    omax_1 = omax_1 + 2;
                    *puVar8 = uVar3;
                    goto LAB_00f17a09;
                  }
                  if (pBVar2 + (sVar5 - 2) < puVar8) {
                    local_a0 = 0xffffffffffffffba;
                    goto LAB_00f17a21;
                  }
                  uVar3 = FSE_decodeSymbol((FSE_DState_t *)&_var_err___2,
                                           (BIT_DStream_t *)&state1_1.table);
                  pBVar9 = omax_1 + 2;
                  *puVar8 = uVar3;
                  if ((uint)bitD_1.bitContainer < 0x41) {
                    if ((ulong)bitD_1._8_8_ < bitD_1.start) {
                      if ((char *)bitD_1._8_8_ == bitD_1.ptr) {
                        if ((uint)bitD_1.bitContainer < 0x40) {
                          local_84 = BIT_DStream_endOfBuffer;
                        }
                        else {
                          local_84 = BIT_DStream_completed;
                        }
                      }
                      else {
                        local_94 = (uint)bitD_1.bitContainer >> 3;
                        bVar10 = (char *)(bitD_1._8_8_ - (ulong)local_94) < bitD_1.ptr;
                        if (bVar10) {
                          local_94 = bitD_1.bitsConsumed - iVar1;
                        }
                        local_98 = (BIT_DStream_status)bVar10;
                        bitD_1._8_8_ = bitD_1._8_8_ - (ulong)local_94;
                        bitD_1.bitContainer._0_4_ = (uint)bitD_1.bitContainer + local_94 * -8;
                        state1_1.table = (void *)MEM_readLEST((void *)bitD_1._8_8_);
                        local_84 = local_98;
                      }
                    }
                    else {
                      local_84 = BIT_reloadDStreamFast((BIT_DStream_t *)&state1_1.table);
                    }
                  }
                  else {
                    local_84 = BIT_DStream_overflow;
                  }
                } while (local_84 != BIT_DStream_overflow);
                uVar3 = FSE_decodeSymbol((FSE_DState_t *)&state2_1.table,
                                         (BIT_DStream_t *)&state1_1.table);
                omax_1 = omax_1 + 3;
                *pBVar9 = uVar3;
LAB_00f17a09:
                local_a0 = (long)omax_1 - (long)pBVar2;
              }
LAB_00f17a21:
              local_1f0 = local_a0;
            }
            else {
              omax = local_1f8;
              pBVar6 = local_1f8 + (local_200 - 3);
              local_1e8 = BIT_initDStream((BIT_DStream_t *)&state1.table,_maxSymbolValue,local_210);
              uVar4 = ERR_isError(local_1e8);
              if (uVar4 == 0) {
                FSE_initDState((FSE_DState_t *)&state2.table,(BIT_DStream_t *)&state1.table,
                               (FSE_DTable *)((long)workSpace + 0x200));
                FSE_initDState((FSE_DState_t *)&_var_err___1,(BIT_DStream_t *)&state1.table,
                               (FSE_DTable *)((long)workSpace + 0x200));
                while( true ) {
                  iVar1 = (int)bitD.ptr;
                  if ((uint)bitD.bitContainer < 0x41) {
                    if ((ulong)bitD._8_8_ < bitD.start) {
                      if ((char *)bitD._8_8_ == bitD.ptr) {
                        if ((uint)bitD.bitContainer < 0x40) {
                          local_c = BIT_DStream_endOfBuffer;
                        }
                        else {
                          local_c = BIT_DStream_completed;
                        }
                      }
                      else {
                        local_1c = (uint)bitD.bitContainer >> 3;
                        bVar10 = (char *)(bitD._8_8_ - (ulong)local_1c) < bitD.ptr;
                        if (bVar10) {
                          local_1c = bitD.bitsConsumed - iVar1;
                        }
                        local_20 = (BIT_DStream_status)bVar10;
                        bitD._8_8_ = bitD._8_8_ - (ulong)local_1c;
                        bitD.bitContainer._0_4_ = (uint)bitD.bitContainer + local_1c * -8;
                        state1.table = (void *)MEM_readLEST((void *)bitD._8_8_);
                        local_c = local_20;
                      }
                    }
                    else {
                      local_c = BIT_reloadDStreamFast((BIT_DStream_t *)&state1.table);
                    }
                  }
                  else {
                    local_c = BIT_DStream_overflow;
                  }
                  pBVar9 = omax;
                  if (local_c != BIT_DStream_unfinished || pBVar6 <= omax) break;
                  uVar3 = FSE_decodeSymbolFast
                                    ((FSE_DState_t *)&state2.table,(BIT_DStream_t *)&state1.table);
                  *omax = uVar3;
                  uVar3 = FSE_decodeSymbolFast
                                    ((FSE_DState_t *)&_var_err___1,(BIT_DStream_t *)&state1.table);
                  omax[1] = uVar3;
                  uVar3 = FSE_decodeSymbolFast
                                    ((FSE_DState_t *)&state2.table,(BIT_DStream_t *)&state1.table);
                  omax[2] = uVar3;
                  uVar3 = FSE_decodeSymbolFast
                                    ((FSE_DState_t *)&_var_err___1,(BIT_DStream_t *)&state1.table);
                  omax[3] = uVar3;
                  omax = omax + 4;
                }
                do {
                  omax = pBVar9;
                  if (pBVar2 + (sVar5 - 2) < omax) {
                    local_148 = 0xffffffffffffffba;
                    goto LAB_00f171c9;
                  }
                  uVar3 = FSE_decodeSymbolFast
                                    ((FSE_DState_t *)&state2.table,(BIT_DStream_t *)&state1.table);
                  puVar8 = omax + 1;
                  *omax = uVar3;
                  if ((uint)bitD.bitContainer < 0x41) {
                    if ((ulong)bitD._8_8_ < bitD.start) {
                      if ((char *)bitD._8_8_ == bitD.ptr) {
                        if ((uint)bitD.bitContainer < 0x40) {
                          local_24 = BIT_DStream_endOfBuffer;
                        }
                        else {
                          local_24 = BIT_DStream_completed;
                        }
                      }
                      else {
                        local_34 = (uint)bitD.bitContainer >> 3;
                        bVar10 = (char *)(bitD._8_8_ - (ulong)local_34) < bitD.ptr;
                        if (bVar10) {
                          local_34 = bitD.bitsConsumed - iVar1;
                        }
                        local_38 = (BIT_DStream_status)bVar10;
                        bitD._8_8_ = bitD._8_8_ - (ulong)local_34;
                        bitD.bitContainer._0_4_ = (uint)bitD.bitContainer + local_34 * -8;
                        state1.table = (void *)MEM_readLEST((void *)bitD._8_8_);
                        local_24 = local_38;
                      }
                    }
                    else {
                      local_24 = BIT_reloadDStreamFast((BIT_DStream_t *)&state1.table);
                    }
                  }
                  else {
                    local_24 = BIT_DStream_overflow;
                  }
                  if (local_24 == BIT_DStream_overflow) {
                    uVar3 = FSE_decodeSymbolFast
                                      ((FSE_DState_t *)&_var_err___1,(BIT_DStream_t *)&state1.table)
                    ;
                    omax = omax + 2;
                    *puVar8 = uVar3;
                    goto LAB_00f171b1;
                  }
                  if (pBVar2 + (sVar5 - 2) < puVar8) {
                    local_148 = 0xffffffffffffffba;
                    goto LAB_00f171c9;
                  }
                  uVar3 = FSE_decodeSymbolFast
                                    ((FSE_DState_t *)&_var_err___1,(BIT_DStream_t *)&state1.table);
                  pBVar9 = omax + 2;
                  *puVar8 = uVar3;
                  if ((uint)bitD.bitContainer < 0x41) {
                    if ((ulong)bitD._8_8_ < bitD.start) {
                      if ((char *)bitD._8_8_ == bitD.ptr) {
                        if ((uint)bitD.bitContainer < 0x40) {
                          local_3c = BIT_DStream_endOfBuffer;
                        }
                        else {
                          local_3c = BIT_DStream_completed;
                        }
                      }
                      else {
                        local_4c = (uint)bitD.bitContainer >> 3;
                        bVar10 = (char *)(bitD._8_8_ - (ulong)local_4c) < bitD.ptr;
                        if (bVar10) {
                          local_4c = bitD.bitsConsumed - iVar1;
                        }
                        local_50 = (BIT_DStream_status)bVar10;
                        bitD._8_8_ = bitD._8_8_ - (ulong)local_4c;
                        bitD.bitContainer._0_4_ = (uint)bitD.bitContainer + local_4c * -8;
                        state1.table = (void *)MEM_readLEST((void *)bitD._8_8_);
                        local_3c = local_50;
                      }
                    }
                    else {
                      local_3c = BIT_reloadDStreamFast((BIT_DStream_t *)&state1.table);
                    }
                  }
                  else {
                    local_3c = BIT_DStream_overflow;
                  }
                } while (local_3c != BIT_DStream_overflow);
                uVar3 = FSE_decodeSymbolFast
                                  ((FSE_DState_t *)&state2.table,(BIT_DStream_t *)&state1.table);
                omax = omax + 3;
                *pBVar9 = uVar3;
LAB_00f171b1:
                local_148 = (long)omax - (long)pBVar2;
              }
              else {
                local_148 = local_1e8;
              }
LAB_00f171c9:
              local_1f0 = local_148;
            }
          }
        }
      }
    }
  }
  return local_1f0;
}

Assistant:

static size_t FSE_decompress_wksp_body_default(void* dst, size_t dstCapacity, const void* cSrc, size_t cSrcSize, unsigned maxLog, void* workSpace, size_t wkspSize)
{
    return FSE_decompress_wksp_body(dst, dstCapacity, cSrc, cSrcSize, maxLog, workSpace, wkspSize, 0);
}